

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

bool __thiscall RoboClaw::write_n(RoboClaw *this,uint8_t byte,...)

{
  uint uVar1;
  ushort uVar2;
  char in_AL;
  void **ppvVar3;
  ssize_t sVar4;
  ushort uVar5;
  uint uVar6;
  _func_int **in_RCX;
  ulong uVar7;
  int iVar8;
  undefined8 in_RDX;
  void *__buf;
  char cVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  uint8_t uVar10;
  bool bVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list marker;
  void **local_100;
  void *local_e8 [3];
  _func_int **local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  cVar9 = '\x02';
  local_e8[2] = (void *)in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    this->m_crc = 0;
    local_100 = &marker[0].overflow_arg_area;
    uVar6 = 0x10;
    if (byte != '\0') {
      uVar10 = '\0';
      do {
        uVar7 = (ulong)uVar6;
        if (uVar7 < 0x29) {
          uVar6 = uVar6 + 8;
          ppvVar3 = (void **)((long)local_e8 + uVar7);
        }
        else {
          ppvVar3 = local_100;
          local_100 = local_100 + 1;
        }
        uVar1 = *(uint *)ppvVar3;
        uVar5 = (ushort)(uVar1 << 8) ^ this->m_crc;
        iVar8 = 8;
        do {
          uVar2 = uVar5 * 2;
          bVar11 = -1 < (short)uVar5;
          uVar5 = uVar2 ^ 0x1021;
          if (bVar11) {
            uVar5 = uVar2;
          }
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        this->m_crc = uVar5;
        in_RCX = this->_vptr_RoboClaw;
        (**in_RCX)(this,(ulong)(uVar1 & 0xff));
        uVar10 = uVar10 + '\x01';
      } while (uVar10 != byte);
    }
    uVar5 = this->m_crc;
    (**this->_vptr_RoboClaw)(this,(ulong)(uVar5 >> 8));
    (**this->_vptr_RoboClaw)(this,(ulong)uVar5 & 0xff);
    sVar4 = read(this,this->m_timeout,__buf,(size_t)in_RCX);
    bVar11 = cVar9 == '\0';
    cVar9 = cVar9 + -1;
    in_RCX = (_func_int **)CONCAT71((int7)((ulong)in_RCX >> 8),bVar11);
  } while (((char)sVar4 != -1) && (!bVar11));
  return (char)sVar4 == -1;
}

Assistant:

bool RoboClaw::write_n(uint8_t byte, ... )
{
    uint8_t trys=MAXRETRY;
    do{
        crc_clear();
        //send data with crc
        va_list marker;
        va_start( marker, byte );     /* Initialize variable arguments. */
        for( uint8_t index=0; index<byte; index++ )
        {
            uint8_t data = va_arg(marker, int);
            crc_update(data);
            write(data);
        }
        va_end( marker );              /* Reset variable arguments.      */
        uint16_t crc = crc_get();
        write(crc>>8);
        write(crc);
        if( read( m_timeout ) == 0xFF )
            return true;
    } while( trys-- );
    return false;
}